

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O0

u_char * ngx_http_log_json_variable(ngx_http_request_t *r,u_char *buf,ngx_http_log_op_t *op)

{
  ngx_http_variable_value_t *pnVar1;
  ngx_http_variable_value_t *value;
  ngx_http_log_op_t *op_local;
  u_char *buf_local;
  ngx_http_request_t *r_local;
  
  pnVar1 = ngx_http_get_indexed_variable(r,op->data);
  r_local = (ngx_http_request_t *)buf;
  if ((pnVar1 != (ngx_http_variable_value_t *)0x0) && ((*(uint *)pnVar1 >> 0x1e & 1) == 0)) {
    if (*(int *)pnVar1 < 0) {
      r_local = (ngx_http_request_t *)
                ngx_escape_json(buf,pnVar1->data,(ulong)(*(uint *)pnVar1 & 0xfffffff));
    }
    else {
      memcpy(buf,pnVar1->data,(ulong)(*(uint *)pnVar1 & 0xfffffff));
      r_local = (ngx_http_request_t *)(buf + (int)(*(uint *)pnVar1 & 0xfffffff));
    }
  }
  return (u_char *)r_local;
}

Assistant:

static u_char *
ngx_http_log_json_variable(ngx_http_request_t *r, u_char *buf,
    ngx_http_log_op_t *op)
{
    ngx_http_variable_value_t  *value;

    value = ngx_http_get_indexed_variable(r, op->data);

    if (value == NULL || value->not_found) {
        return buf;
    }

    if (value->escape == 0) {
        return ngx_cpymem(buf, value->data, value->len);

    } else {
        return (u_char *) ngx_escape_json(buf, value->data, value->len);
    }
}